

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O0

void lzham::lzham_sleep(uint milliseconds)

{
  uint in_EDI;
  int msecs_to_sleep;
  undefined4 local_c;
  undefined4 local_4;
  
  for (local_4 = in_EDI; local_4 != 0; local_4 = local_4 - local_c) {
    if (local_4 < 1000) {
      local_c = local_4;
    }
    else {
      local_c = 1000;
    }
    usleep(local_c * 1000);
  }
  return;
}

Assistant:

inline void lzham_sleep(unsigned int milliseconds)
   {
#ifdef WIN32
      struct timespec interval;
      interval.tv_sec = milliseconds / 1000;
      interval.tv_nsec = (milliseconds % 1000) * 1000000L;
      pthread_delay_np(&interval);
#else
      while (milliseconds)
      {
         int msecs_to_sleep = LZHAM_MIN(milliseconds, 1000);
         usleep(msecs_to_sleep * 1000);
         milliseconds -= msecs_to_sleep;
      }
#endif
   }